

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlocalserver.cpp
# Opt level: O0

void QLocalServer::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  undefined8 *puVar2;
  bool bVar3;
  QtMocHelpers *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  QBindable<QFlags<QLocalServer::SocketOption>_> QVar4;
  void *_v_1;
  void *_v;
  QLocalServer *_t;
  QFlagsStorage<QLocalServer::SocketOption> t;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  QLocalServer *in_stack_ffffffffffffff98;
  QLocalServerPrivate *in_stack_ffffffffffffffb8;
  QUntypedPropertyData *local_20;
  QBindableInterface *local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_ffffffffffffff94 = in_EDX;
    if (in_EDX == 0) {
      newConnection((QLocalServer *)0x37ce2c);
    }
    else if (in_EDX == 1) {
      d_func((QLocalServer *)0x37ce38);
      QLocalServerPrivate::_q_onNewConnection(in_stack_ffffffffffffffb8);
    }
  }
  if ((in_ESI != 5) ||
     (bVar3 = QtMocHelpers::indexOfMethod<void(QLocalServer::*)()>
                        (in_RCX,(void **)newConnection,0,0), !bVar3)) {
    if ((in_ESI == 1) && (t.i = (Int)((ulong)*(undefined8 *)in_RCX >> 0x20), in_EDX == 0)) {
      socketOptions((QLocalServer *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      QtMocHelpers::assignFlags<QFlags<QLocalServer::SocketOption>>
                ((void *)0x37cec7,(QFlags<QLocalServer::SocketOption>)t.i);
    }
    if ((in_ESI == 2) && (in_stack_ffffffffffffff98 = *(QLocalServer **)in_RCX, in_EDX == 0)) {
      setSocketOptions((QLocalServer *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                       ,(QFlagsStorageHelper<QLocalServer::SocketOption,_4>)
                        SUB84((ulong)in_stack_ffffffffffffff98 >> 0x20,0));
    }
    if ((in_ESI == 8) && (in_EDX == 0)) {
      QVar4 = bindableSocketOptions(in_stack_ffffffffffffff98);
      puVar2 = *(undefined8 **)in_RCX;
      local_20 = QVar4.super_QUntypedBindable.data;
      *puVar2 = local_20;
      local_18 = QVar4.super_QUntypedBindable.iface;
      puVar2[1] = local_18;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLocalServer::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QLocalServer *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->newConnection(); break;
        case 1: _t->d_func()->_q_onNewConnection(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QLocalServer::*)()>(_a, &QLocalServer::newConnection, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: QtMocHelpers::assignFlags<SocketOptions>(_v, _t->socketOptions()); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSocketOptions(*reinterpret_cast<SocketOptions*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableSocketOptions(); break;
        default: break;
        }
    }
}